

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O3

void __thiscall QCollator::QCollator(QCollator *this,QLocale *locale)

{
  QCollatorPrivate *pQVar1;
  
  pQVar1 = (QCollatorPrivate *)operator_new(0x20);
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  QLocale::QLocale(&pQVar1->locale,locale);
  pQVar1->caseSensitivity = CaseSensitive;
  pQVar1->numericMode = false;
  pQVar1->ignorePunctuation = false;
  pQVar1->dirty = true;
  pQVar1->collator = (CollatorType)0x0;
  this->d = pQVar1;
  return;
}

Assistant:

QCollator::QCollator(const QLocale &locale)
    : d(new QCollatorPrivate(locale))
{
}